

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Vector3 *vector)

{
  ostream *poVar1;
  double *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Vector3 &vector) {
    os << "(" << vector.x << "," << vector.y << "," << vector.z << ")";
    return os;
}